

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::doAddRow(SPxLPBase<double> *this,LPRowBase<double> *row,bool scale)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxScaler<double> *pSVar4;
  Nonzero<double> *pNVar5;
  bool bVar6;
  undefined7 in_register_00000011;
  int iVar7;
  Item *pIVar8;
  long in_FS_OFFSET;
  double dVar9;
  double __x;
  int idx;
  double val;
  int local_bc;
  int local_9c;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  double local_78;
  DataKey local_70;
  LPColBase<double> local_68;
  
  iVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_68.up = -NAN;
  local_9c = iVar2;
  LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,(DataKey *)&local_68,row);
  pIVar8 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
           (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx;
  local_bc = 0;
  if (((int)CONCAT71(in_register_00000011,scale) != 0) &&
     (pSVar4 = this->lp_scaler, pSVar4 != (SPxScaler<double> *)0x0)) {
    local_bc = (*pSVar4->_vptr_SPxScaler[1])
                         (pSVar4,pIVar8,&(this->super_LPColSetBase<double>).scaleExp);
    local_98 = (this->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar2];
    ::soplex::infinity::__tls_init();
    dVar9 = *(double *)(in_FS_OFFSET + -8);
    uStack_90 = 0;
    bVar6 = local_98 < dVar9;
    local_98 = dVar9;
    if (bVar6) {
      dVar9 = ldexp((this->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2],local_bc);
      (this->super_LPRowSetBase<double>).right.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar2] = dVar9;
    }
    local_80 = (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar2];
    ::soplex::infinity::__tls_init();
    if (-local_98 < local_80) {
      dVar9 = ldexp((this->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2],local_bc);
      (this->super_LPRowSetBase<double>).left.val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [iVar2] = dVar9;
    }
    dVar9 = ldexp((this->super_LPRowSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar2],local_bc);
    (this->super_LPRowSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar2] = dVar9;
    (this->super_LPRowSetBase<double>).scaleExp.data[iVar2] = local_bc;
  }
  dVar9 = (double)(long)(pIVar8->data).super_SVectorBase<double>.memused;
  if (0 < (long)dVar9) {
    do {
      dVar1 = (double)((long)dVar9 + -1);
      pNVar5 = (pIVar8->data).super_SVectorBase<double>.m_elem;
      iVar2 = pNVar5[(long)dVar1].idx;
      __x = pNVar5[(long)dVar1].val;
      local_98 = dVar1;
      if (scale) {
        __x = ldexp(__x,(this->super_LPColSetBase<double>).scaleExp.data[iVar2] + local_bc);
        (pIVar8->data).super_SVectorBase<double>.m_elem[(long)dVar1].val = __x;
      }
      local_78 = __x;
      if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
        LPColBase<double>::LPColBase(&local_68,0);
        iVar7 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (iVar7 <= iVar2) {
          iVar7 = (iVar2 - iVar7) + 1;
          do {
            local_70.info = 0;
            local_70.idx = -1;
            LPColSetBase<double>::add(&this->super_LPColSetBase<double>,&local_70,&local_68);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
        if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
          free(local_68.vec.theelem);
        }
      }
      SVSetBase<double>::add2
                (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
                 (SVectorBase<double> *)
                 ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx),1
                 ,&local_9c,&local_78);
      bVar6 = 1 < (long)dVar9;
      dVar9 = local_98;
    } while (bVar6);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)(uint)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar3));
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }